

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O1

bool wabt::operator<(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  Enum EVar1;
  Enum EVar2;
  pointer __s2;
  int iVar3;
  pointer __s1;
  ulong __n;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  bool bVar7;
  
  EVar1 = (lhs->opcode_).enum_;
  EVar2 = (rhs->opcode_).enum_;
  if (EVar1 < EVar2) {
    return true;
  }
  if (EVar1 <= EVar2) {
    if ((int)lhs->kind_ < (int)rhs->kind_) {
      return true;
    }
    if ((int)lhs->kind_ <= (int)rhs->kind_) {
      __s1 = (lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      __s2 = (rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      uVar4 = (long)(lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__s1;
      uVar6 = (long)(rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__s2;
      __n = uVar4;
      if (uVar6 < uVar4) {
        __n = uVar6;
      }
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = memcmp(__s1,__s2,__n);
        bVar7 = iVar3 == 0;
        __s1 = (pointer)(long)iVar3;
      }
      bVar5 = (byte)(uVar4 - uVar6 >> 0x38);
      if (!bVar7) {
        bVar5 = (byte)((ulong)__s1 >> 0x38);
      }
      return (bool)(bVar5 >> 7);
    }
  }
  return false;
}

Assistant:

std::pair<const T*, size_t> OpcodeInfo::GetDataArray() const {
  if (data_.empty()) {
    return std::pair<const T*, size_t>(nullptr, 0);
  }

  assert(data_.size() % sizeof(T) == 0);
  return std::make_pair(reinterpret_cast<const T*>(data_.data()),
                        data_.size() / sizeof(T));
}